

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t exr_set_compression(exr_context_t ctxt,int part_index,exr_compression_t ctype)

{
  exr_result_t eVar1;
  int iVar2;
  undefined4 in_EDX;
  int in_ESI;
  char *in_RDI;
  exr_priv_part_t part;
  int32_t in_stack_00000010;
  exr_result_t rv;
  exr_attribute_t *attr;
  exr_attribute_t **in_stack_00000040;
  exr_const_context_t_conflict in_stack_ffffffffffffffd0;
  exr_const_context_t_conflict c;
  int local_24;
  exr_result_t local_4;
  
  local_24 = 0;
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    internal_exr_lock(in_stack_ffffffffffffffd0);
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      internal_exr_unlock(in_stack_ffffffffffffffd0);
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      c = *(exr_const_context_t_conflict *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if (*in_RDI == '\0') {
        internal_exr_unlock(c);
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,8);
      }
      else if (*in_RDI == '\x03') {
        internal_exr_unlock(c);
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,0x15);
      }
      else {
        if (c->do_read ==
            (_func_exr_result_t_exr_const_context_t_void_ptr_uint64_t_uint64_t_ptr_int64_t_ptr__INTERNAL_EXR_READ_MODE
             *)0x0) {
          local_24 = exr_attr_list_add(ctxt,(exr_attribute_list_t *)CONCAT44(part_index,ctype),
                                       (char *)attr,rv,in_stack_00000010,(uint8_t **)part,
                                       in_stack_00000040);
        }
        else if (*(int *)(c->do_read + 0x14) != 5) {
          internal_exr_unlock(c);
          eVar1 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,6,"Invalid required attribute type \'%s\' for \'%s\'",
                             *(undefined8 *)(c->do_read + 8),"compression");
          return eVar1;
        }
        if (local_24 == 0) {
          c->do_read[0x18] = SUB41(in_EDX,0);
          *(undefined4 *)&c->output_file_offset = in_EDX;
          iVar2 = exr_compression_lines_per_chunk((exr_compression_t)c->output_file_offset);
          *(short *)&(c->first_part).compression = (short)iVar2;
        }
        internal_exr_unlock(c);
        local_4 = local_24;
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_set_compression (
    exr_context_t ctxt, int part_index, exr_compression_t ctype)
{
    REQ_ATTR_FIND_CREATE (compression, EXR_ATTR_COMPRESSION);
    if (rv == EXR_ERR_SUCCESS)
    {
        attr->uc        = (uint8_t) ctype;
        part->comp_type = ctype;
        part->lines_per_chunk =
            ((int16_t) exr_compression_lines_per_chunk (part->comp_type));
    }
    return EXR_UNLOCK_AND_RETURN (rv);
}